

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

size_t google::protobuf::internal::MapValueRefDataOnlyByteSize
                 (FieldDescriptor *field,MapValueRef *value)

{
  long lVar1;
  Type TVar2;
  int32 iVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  string *psVar7;
  ulong uVar8;
  Message *pMVar9;
  undefined4 extraout_var;
  int64 iVar10;
  ulong uVar11;
  LogMessage *pLVar12;
  LogFinisher local_41;
  LogMessage local_40;
  
  TVar2 = FieldDescriptor::type(field);
  switch(TVar2) {
  case TYPE_DOUBLE:
  case TYPE_FIXED64:
  case TYPE_SFIXED64:
    sVar6 = 8;
    break;
  case TYPE_FLOAT:
  case TYPE_FIXED32:
  case TYPE_SFIXED32:
    sVar6 = 4;
    break;
  case TYPE_INT64:
    uVar11 = MapValueRef::GetInt64Value(value);
    goto LAB_005e6b34;
  case TYPE_UINT64:
    uVar11 = MapValueRef::GetUInt64Value(value);
    goto LAB_005e6b34;
  case TYPE_INT32:
    uVar4 = MapValueRef::GetInt32Value(value);
    goto LAB_005e6bcd;
  case TYPE_BOOL:
    sVar6 = 1;
    break;
  case TYPE_STRING:
  case TYPE_BYTES:
    psVar7 = MapValueRef::GetStringValue_abi_cxx11_(value);
    uVar8 = psVar7->_M_string_length & 0xffffffff;
    uVar11 = psVar7->_M_string_length;
    goto LAB_005e6adf;
  case TYPE_GROUP:
    LogMessage::LogMessage
              (&local_40,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x500);
    pLVar12 = LogMessage::operator<<(&local_40,"Unsupported");
    LogFinisher::operator=(&local_41,pLVar12);
    goto LAB_005e6bb7;
  case TYPE_MESSAGE:
    pMVar9 = MapValueRef::GetMessageValue(value);
    iVar5 = (*(pMVar9->super_MessageLite)._vptr_MessageLite[0xc])(pMVar9);
    uVar8 = CONCAT44(extraout_var,iVar5);
    uVar11 = uVar8;
LAB_005e6adf:
    uVar4 = (uint)uVar8 | 1;
    iVar5 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    sVar6 = (iVar5 * 9 + 0x49U >> 6) + uVar11;
    break;
  case TYPE_UINT32:
    uVar4 = MapValueRef::GetUInt32Value(value);
    goto LAB_005e6bd1;
  case TYPE_ENUM:
    uVar4 = MapValueRef::GetEnumValue(value);
LAB_005e6bcd:
    if ((int)uVar4 < 0) {
      return 10;
    }
LAB_005e6bd1:
    iVar5 = 0x1f;
    if ((uVar4 | 1) != 0) {
      for (; (uVar4 | 1) >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    goto LAB_005e6bd7;
  case TYPE_SINT32:
    iVar3 = MapValueRef::GetInt32Value(value);
    uVar4 = iVar3 >> 0x1f ^ iVar3 * 2 | 1;
    iVar5 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    goto LAB_005e6bd7;
  case MAX_TYPE:
    iVar10 = MapValueRef::GetInt64Value(value);
    uVar11 = iVar10 >> 0x3f ^ iVar10 * 2;
LAB_005e6b34:
    lVar1 = 0x3f;
    if ((uVar11 | 1) != 0) {
      for (; (uVar11 | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    iVar5 = (int)lVar1;
LAB_005e6bd7:
    sVar6 = (size_t)(iVar5 * 9 + 0x49U >> 6);
    break;
  default:
    LogMessage::LogMessage
              (&local_40,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x520);
    pLVar12 = LogMessage::operator<<(&local_40,"Cannot get here");
    LogFinisher::operator=(&local_41,pLVar12);
LAB_005e6bb7:
    LogMessage::~LogMessage(&local_40);
    sVar6 = 0;
  }
  return sVar6;
}

Assistant:

static size_t MapValueRefDataOnlyByteSize(const FieldDescriptor* field,
                                          const MapValueRef& value) {
  switch (field->type()) {
    case FieldDescriptor::TYPE_GROUP:
      GOOGLE_LOG(FATAL) << "Unsupported";
      return 0;
#define CASE_TYPE(FieldType, CamelFieldType, CamelCppType) \
  case FieldDescriptor::TYPE_##FieldType:                  \
    return WireFormatLite::CamelFieldType##Size(           \
        value.Get##CamelCppType##Value());

#define FIXED_CASE_TYPE(FieldType, CamelFieldType) \
  case FieldDescriptor::TYPE_##FieldType:          \
    return WireFormatLite::k##CamelFieldType##Size;

      CASE_TYPE(INT32, Int32, Int32);
      CASE_TYPE(INT64, Int64, Int64);
      CASE_TYPE(UINT32, UInt32, UInt32);
      CASE_TYPE(UINT64, UInt64, UInt64);
      CASE_TYPE(SINT32, SInt32, Int32);
      CASE_TYPE(SINT64, SInt64, Int64);
      CASE_TYPE(STRING, String, String);
      CASE_TYPE(BYTES, Bytes, String);
      CASE_TYPE(ENUM, Enum, Enum);
      CASE_TYPE(MESSAGE, Message, Message);
      FIXED_CASE_TYPE(FIXED32, Fixed32);
      FIXED_CASE_TYPE(FIXED64, Fixed64);
      FIXED_CASE_TYPE(SFIXED32, SFixed32);
      FIXED_CASE_TYPE(SFIXED64, SFixed64);
      FIXED_CASE_TYPE(DOUBLE, Double);
      FIXED_CASE_TYPE(FLOAT, Float);
      FIXED_CASE_TYPE(BOOL, Bool);

#undef CASE_TYPE
#undef FIXED_CASE_TYPE
  }
  GOOGLE_LOG(FATAL) << "Cannot get here";
  return 0;
}